

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 id_00;
  uint *puVar1;
  size_t local_38;
  ImGuiID id;
  ImGuiID seed;
  char *str_end_local;
  char *str_local;
  ImGuiWindow *this_local;
  
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  if (str_end == (char *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = (long)str_end - (long)str;
  }
  id_00 = ImHashStr(str,local_38,*puVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
    return id;
}